

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_hit_attribute(Impl *this)

{
  bool bVar1;
  Id IVar2;
  ptrdiff_t pVar3;
  Type *pTVar4;
  mapped_type *pmVar5;
  Type *elem_type_1;
  Id local_54;
  Type *pTStack_50;
  Id hit_attribute_var;
  Type *elem_type;
  Argument *arg;
  __normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>
  local_38;
  IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
  args;
  __normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>
  local_28;
  Function *local_20;
  Function *func;
  Impl *this_local;
  
  func = (Function *)this;
  local_20 = get_entry_point_function(this->entry_point_meta);
  local_28._M_current = (Argument **)LLVMBC::Function::arg_end(local_20);
  args = LLVMBC::Function::arg_begin(local_20);
  pVar3 = LLVMBC::
          IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
          ::operator-((IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
                       *)&local_28,&args);
  if (pVar3 < 2) {
    if ((this->execution_model == ExecutionModelIntersectionKHR) &&
       (this->llvm_hit_attribute_output_type != (Type *)0x0)) {
      pTVar4 = LLVMBC::Type::getPointerElementType(this->llvm_hit_attribute_output_type);
      IVar2 = get_type_id(this,pTVar4,0);
      IVar2 = create_variable(this,StorageClassHitAttributeKHR,IVar2,"hit");
      this->llvm_hit_attribute_output_value = IVar2;
    }
  }
  else {
    local_38._M_current = (Argument **)LLVMBC::Function::arg_begin(local_20);
    arg = (Argument *)
          LLVMBC::
          IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
          ::operator++((IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
                        *)&local_38);
    elem_type = (Type *)LLVMBC::
                        IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
                        ::operator*((IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
                                     *)&local_38);
    pTVar4 = LLVMBC::Value::getType((Value *)elem_type);
    bVar1 = LLVMBC::isa<LLVMBC::PointerType>(pTVar4);
    if (!bVar1) {
      return false;
    }
    pTVar4 = LLVMBC::Value::getType((Value *)elem_type);
    pTStack_50 = LLVMBC::Type::getPointerElementType(pTVar4);
    IVar2 = get_type_id(this,pTStack_50,0);
    local_54 = create_variable(this,StorageClassHitAttributeKHR,IVar2,"hit");
    elem_type_1 = elem_type;
    pmVar5 = std::
             unordered_map<const_LLVMBC::Value_*,_spv::StorageClass,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>_>
             ::operator[](&this->handle_to_storage_class,(key_type *)&elem_type_1);
    *pmVar5 = StorageClassHitAttributeKHR;
    rewrite_value(this,(Value *)elem_type,local_54);
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_hit_attribute()
{
	auto *func = get_entry_point_function(entry_point_meta);

	// The second argument to a RT entry point is always a pointer to hit attribute.
	if (func->arg_end() - func->arg_begin() >= 2)
	{
		auto args = func->arg_begin();
		++args;
		auto &arg = *args;
		if (!llvm::isa<llvm::PointerType>(arg.getType()))
			return false;
		auto *elem_type = arg.getType()->getPointerElementType();

		spv::Id hit_attribute_var = create_variable(spv::StorageClassHitAttributeKHR, get_type_id(elem_type), "hit");
		handle_to_storage_class[&arg] = spv::StorageClassHitAttributeKHR;
		rewrite_value(&arg, hit_attribute_var);
	}
	else if (execution_model == spv::ExecutionModelIntersectionKHR && llvm_hit_attribute_output_type)
	{
		auto *elem_type = llvm_hit_attribute_output_type->getPointerElementType();
		llvm_hit_attribute_output_value = create_variable(spv::StorageClassHitAttributeKHR,
		                                                  get_type_id(elem_type), "hit");
	}

	return true;
}